

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O2

size_t __thiscall
kj::_::BTreeImpl::verifyNode
          (BTreeImpl *this,size_t size,FunctionParam<bool_(unsigned_int,_unsigned_int)> *f,uint pos,
          uint height,MaybeUint maxRow)

{
  MaybeUint maxRow_00;
  char cVar1;
  uint uVar2;
  Leaf *this_00;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  Fault f_1;
  
  this_00 = (Leaf *)(this->tree + pos);
  if (height == 0) {
    uVar2 = Leaf::size(this_00);
    sVar3 = (size_t)uVar2;
    uVar6 = 0;
    while (uVar2 != uVar6) {
      uVar4 = (ulong)(this_00->rows[uVar6].i - 1);
      if (size <= uVar4) {
        Debug::Fault::Fault(&f_1,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                            ,0xe2,FAILED,"*leaf.rows[i] < size","");
        Debug::Fault::fatal(&f_1);
      }
      uVar6 = uVar6 + 1;
      if (uVar6 < uVar2) {
        cVar1 = (**f->space[0])(f,uVar4,this_00->rows[uVar6].i - 1);
        if (cVar1 == '\0') {
          Debug::Fault::Fault(&f_1,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                              ,0xe4,FAILED,"f(*leaf.rows[i], *leaf.rows[i + 1])","");
          Debug::Fault::fatal(&f_1);
        }
      }
      else if ((maxRow.i != 0) && (this_00->rows[uVar2 - 1].i != maxRow.i)) {
        Debug::Fault::Fault(&f_1,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                            ,0xe6,FAILED,"maxRow == nullptr || leaf.rows[n-1] == maxRow","");
        Debug::Fault::fatal(&f_1);
      }
    }
  }
  else {
    uVar2 = Parent::keyCount((Parent *)this_00);
    uVar6 = 1;
    lVar5 = 0;
    while( true ) {
      if (uVar6 - uVar2 == 1) break;
      uVar4 = (ulong)(uVar6 - 1);
      maxRow_00.i = this_00->rows[uVar4 - 1].i;
      if (size <= maxRow_00.i - 1) {
        Debug::Fault::Fault(&f_1,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                            ,0xd7,FAILED,"*parent.keys[i] < size","");
        Debug::Fault::fatal(&f_1);
      }
      sVar3 = verifyNode(this,size,f,this_00->rows[uVar4 + 6].i,height - 1,maxRow_00);
      if (uVar6 != uVar2) {
        cVar1 = (**f->space[0])(f,this_00->rows[uVar4 - 1].i - 1,
                                this_00->rows[(ulong)uVar6 - 1].i - 1);
        if (cVar1 == '\0') {
          Debug::Fault::Fault(&f_1,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                              ,0xd9,FAILED,"i + 1 == n || f(*parent.keys[i], *parent.keys[i + 1])",
                              "");
          Debug::Fault::fatal(&f_1);
        }
      }
      lVar5 = lVar5 + sVar3;
      uVar6 = uVar6 + 1;
    }
    sVar3 = verifyNode(this,size,f,this_00->rows[(ulong)uVar2 + 6].i,height - 1,maxRow);
    sVar3 = sVar3 + lVar5;
    if (maxRow.i != 0) {
      cVar1 = (**f->space[0])(f,this_00->rows[(ulong)(uVar2 - 1) - 1].i - 1,maxRow.i - 1);
      if (cVar1 == '\0') {
        Debug::Fault::Fault(&f_1,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                            ,0xdc,FAILED,"maxRow == nullptr || f(*parent.keys[n-1], *maxRow)","");
        Debug::Fault::fatal(&f_1);
      }
    }
  }
  return sVar3;
}

Assistant:

size_t BTreeImpl::verifyNode(size_t size, FunctionParam<bool(uint, uint)>& f,
                             uint pos, uint height, MaybeUint maxRow) {
  if (height > 0) {
    auto& parent = tree[pos].parent;

    auto n = parent.keyCount();
    size_t total = 0;
    for (auto i: kj::zeroTo(n)) {
      KJ_ASSERT(*parent.keys[i] < size);
      total += verifyNode(size, f, parent.children[i], height - 1, parent.keys[i]);
      KJ_ASSERT(i + 1 == n || f(*parent.keys[i], *parent.keys[i + 1]));
    }
    total += verifyNode(size, f, parent.children[n], height - 1, maxRow);
    KJ_ASSERT(maxRow == nullptr || f(*parent.keys[n-1], *maxRow));
    return total;
  } else {
    auto& leaf = tree[pos].leaf;
    auto n = leaf.size();
    for (auto i: kj::zeroTo(n)) {
      KJ_ASSERT(*leaf.rows[i] < size);
      if (i + 1 < n) {
        KJ_ASSERT(f(*leaf.rows[i], *leaf.rows[i + 1]));
      } else {
        KJ_ASSERT(maxRow == nullptr || leaf.rows[n-1] == maxRow);
      }
    }
    return n;
  }
}